

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_50b73::GetSourceiv
          (anon_unknown_dwarf_50b73 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<int,_18446744073709551615UL> values)

{
  anon_unknown_dwarf_50b73 aVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  Voice *pVVar6;
  long *plVar7;
  __pointer_type pBVar8;
  runtime_error *prVar9;
  SourceProp prop_00;
  undefined4 in_register_0000000c;
  uint *puVar10;
  ALCcontext *Context_00;
  pointer piVar11;
  __pointer_type pBVar12;
  span<double,_18446744073709551615UL> values_00;
  span<double,_18446744073709551615UL> values_01;
  span<double,_18446744073709551615UL> values_02;
  undefined8 uStack_80;
  double dvals [6];
  string local_48;
  
  puVar10 = (uint *)CONCAT44(in_register_0000000c,prop);
  piVar11 = values.mData;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  iVar3 = (int)Context;
  prop_00 = (SourceProp)dvals;
  switch(iVar3) {
  case 0x1001:
  case 0x1002:
  case 0x1003:
  case 0x100a:
  case 0x100d:
  case 0x100e:
  case 0x1020:
  case 0x1021:
  case 0x1022:
  case 0x1023:
  case 0x1024:
  case 0x1025:
  case 0x1026:
  case 0x1031:
    goto switchD_00123c80_caseD_1001;
  case 0x1004:
  case 0x1005:
  case 0x1006:
    values_01.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_01.mDataEnd == (pointer)0x3) || (values_01.mDataEnd == (pointer)0x6)) {
      values_01.mData = dvals + 3;
      bVar4 = GetSourcedv(this,Source,Context_00,prop_00,values_01);
      if (!bVar4) {
        return false;
      }
      *(ulong *)puVar10 = CONCAT44((int)dvals[1],(int)dvals[0]);
      puVar10[2] = (int)dvals[2];
      return true;
    }
    uStack_80 = 3;
    values_00.mDataEnd = values_01.mDataEnd;
    break;
  case 0x1007:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      uVar5 = (uint)(byte)this[0x65];
      goto LAB_00123cbc;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1007;
    break;
  case 0x1008:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1030:
  case 0x1032:
switchD_00123c80_caseD_1008:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    ALCcontext::setError
              ((ALCcontext *)Source,0xa002,"Invalid source integer property 0x%04x",Context_00);
    return false;
  case 0x1009:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      uVar5 = 0;
      if (((*(int *)(this + 0x174) == 0x1028) && (*(long *)(this + 0x180) != 0)) &&
         (lVar2 = *(long *)(*(long *)(this + 0x180) + 0x10), lVar2 != 0)) {
        uVar5 = *(uint *)(lVar2 + 0x74);
      }
      goto LAB_00123cbc;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1009;
    break;
  case 0x100f:
    if ((long)piVar11 - (long)puVar10 == 0x18) {
      values_02.mDataEnd = (pointer)0x18;
      values_02.mData = (pointer)&local_48;
      bVar4 = GetSourcedv(this,Source,(ALCcontext *)0x100f,prop_00,values_02);
      if (bVar4) {
        *puVar10 = (int)dvals[0];
        puVar10[1] = (int)dvals[1];
        puVar10[2] = (int)dvals[2];
        puVar10[3] = (int)dvals[3];
        *(ulong *)(puVar10 + 4) = CONCAT44((int)dvals[5],(int)dvals[4]);
        return true;
      }
      return false;
    }
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    uStack_80 = 6;
    Context_00 = (ALCcontext *)0x100f;
    break;
  case 0x1010:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      pVVar6 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source);
      uVar5 = *(uint *)(this + 0x178);
      if (uVar5 == 0x1012 && pVVar6 == (Voice *)0x0) {
        *(undefined4 *)(this + 0x178) = 0x1014;
        uVar5 = 0x1014;
      }
      goto LAB_00123cbc;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1010;
    break;
  case 0x1015:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      plVar7 = *(long **)(this + 0x180);
      if (plVar7 == (long *)0x0) {
LAB_00124027:
        *puVar10 = 0;
        return true;
      }
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
LAB_00124020:
      *puVar10 = uVar5;
      return true;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1015;
    break;
  case 0x1016:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      if ((this[0x65] != (anon_unknown_dwarf_50b73)0x0) || (*(int *)(this + 0x174) != 0x1029))
      goto LAB_00124027;
      pBVar12 = *(__pointer_type *)(this + 0x180);
      pVVar6 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source);
      if (pVVar6 == (Voice *)0x0) {
        pBVar8 = (__pointer_type)0x0;
        if (*(int *)(this + 0x178) == 0x1011) {
          pBVar8 = pBVar12;
        }
      }
      else {
        pBVar8 = (pVVar6->mCurrentBuffer)._M_b._M_p;
      }
      uVar5 = 0;
      for (; (pBVar12 != (__pointer_type)0x0 && (pBVar12 != pBVar8));
          pBVar12 = (pBVar12->mNext)._M_b._M_p) {
        uVar5 = uVar5 + 1;
      }
      goto LAB_00124020;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1016;
    break;
  case 0x1027:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      uVar5 = *(uint *)(this + 0x174);
      goto LAB_00123cbc;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1027;
    break;
  case 0x1033:
    values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      aVar1 = this[0x70];
      if (2 < (byte)aVar1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_48,(uint)(byte)aVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dvals,
                       "Invalid DirectMode: ",&local_48);
        std::runtime_error::runtime_error(prVar9,(string *)dvals);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00124094:
      *puVar10 = (uint)(byte)aVar1;
      return true;
    }
    uStack_80 = 1;
    Context_00 = (ALCcontext *)0x1033;
    break;
  default:
    switch(iVar3) {
    case 0x20007:
    case 0x20008:
    case 0x20009:
      goto switchD_00123c80_caseD_1001;
    case 0x2000a:
      values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0x2000a;
        goto LAB_001240fb;
      }
      uVar5 = (uint)(byte)this[0x72];
      break;
    case 0x2000b:
      values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0x2000b;
        goto LAB_001240fb;
      }
      uVar5 = (uint)(byte)this[0x73];
      break;
    case 0x2000c:
      values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0x2000c;
        goto LAB_001240fb;
      }
      uVar5 = (uint)(byte)this[0x74];
      break;
    default:
      if (iVar3 == 0xd000) {
        values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
        if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
          uVar5 = *(uint *)(this + 0x68);
          break;
        }
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0xd000;
        goto LAB_001240fb;
      }
      if (iVar3 == 0x1212) {
        values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
        if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
          uVar5 = *(uint *)(this + 0x6c);
          break;
        }
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0x1212;
        goto LAB_001240fb;
      }
      if (iVar3 == 0x1214) {
        values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
        if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
          aVar1 = this[0x71];
          if (2 < (byte)aVar1) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_48,(uint)(byte)aVar1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           dvals,"Invalid SpatializeMode: ",&local_48);
            std::runtime_error::runtime_error(prVar9,(string *)dvals);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00124094;
        }
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0x1214;
        goto LAB_001240fb;
      }
      if (iVar3 != 0xc000) {
        if (iVar3 != 0x202) goto switchD_00123c80_caseD_1008;
        values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
        if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
          uVar5 = (uint)(byte)this[100];
          break;
        }
        uStack_80 = 1;
        Context_00 = (ALCcontext *)0x202;
        goto LAB_001240fb;
      }
switchD_00123c80_caseD_1001:
      values_00.mDataEnd = (pointer)((long)piVar11 - (long)puVar10 >> 2);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_80 = 1;
        goto LAB_001240fb;
      }
      values_00.mData = dvals + 1;
      bVar4 = GetSourcedv(this,Source,Context_00,prop_00,values_00);
      if (!bVar4) {
        return false;
      }
      uVar5 = (uint)dvals[0];
    }
LAB_00123cbc:
    *puVar10 = uVar5;
    return true;
  }
LAB_001240fb:
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uStack_80,values_00.mDataEnd);
  return false;
}

Assistant:

bool GetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<int> values)
{
    double dvals[MaxValues];
    bool err;

    switch(prop)
    {
    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        values[0] = Source->HeadRelative;
        return true;

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        values[0] = Source->Looping;
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            BufferlistItem *BufferList{nullptr};
            if(Source->SourceType == AL_STATIC) BufferList = Source->queue;
            BufferStorage *buffer{nullptr};
            if(BufferList) buffer = BufferList->mBuffer;
            values[0] = buffer ? static_cast<int>(BufferFromStorage(buffer)->id) : 0;
        }
        return true;

    case AL_SOURCE_STATE:
        CHECKSIZE(values, 1);
        values[0] = GetSourceState(Source, GetSourceVoice(Source, Context));
        return true;

    case AL_BUFFERS_QUEUED:
        CHECKSIZE(values, 1);
        if(BufferlistItem *BufferList{Source->queue})
        {
            ALsizei count{0};
            do {
                ++count;
                BufferList = BufferList->mNext.load(std::memory_order_relaxed);
            } while(BufferList != nullptr);
            values[0] = count;
        }
        else
            values[0] = 0;
        return true;

    case AL_BUFFERS_PROCESSED:
        CHECKSIZE(values, 1);
        if(Source->Looping || Source->SourceType != AL_STREAMING)
        {
            /* Buffers on a looping source are in a perpetual state of PENDING,
             * so don't report any as PROCESSED
             */
            values[0] = 0;
        }
        else
        {
            const BufferlistItem *BufferList{Source->queue};
            const BufferlistItem *Current{nullptr};
            ALsizei played{0};

            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice != nullptr)
                Current = voice->mCurrentBuffer.load(std::memory_order_relaxed);
            else if(Source->state == AL_INITIAL)
                Current = BufferList;

            while(BufferList && BufferList != Current)
            {
                ++played;
                BufferList = BufferList->mNext.load(std::memory_order_relaxed);
            }
            values[0] = played;
        }
        return true;

    case AL_SOURCE_TYPE:
        CHECKSIZE(values, 1);
        values[0] = Source->SourceType;
        return true;

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->DryGainHFAuto;
        return true;

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->WetGainAuto;
        return true;

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->WetGainHFAuto;
        return true;

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        values[0] = EnumFromDirectMode(Source->DirectChannels);
        return true;

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        values[0] = static_cast<int>(Source->mDistanceModel);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        values[0] = static_cast<int>(Source->mResampler);
        return true;

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        values[0] = EnumFromSpatializeMode(Source->mSpatialize);
        return true;

    /* 1x float/double */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
    case AL_DOPPLER_FACTOR:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 1u})) != false)
            values[0] = static_cast<int>(dvals[0]);
        return err;

    /* 3x float/double */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 3u})) != false)
        {
            values[0] = static_cast<int>(dvals[0]);
            values[1] = static_cast<int>(dvals[1]);
            values[2] = static_cast<int>(dvals[2]);
        }
        return err;

    /* 6x float/double */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 6u})) != false)
        {
            values[0] = static_cast<int>(dvals[0]);
            values[1] = static_cast<int>(dvals[1]);
            values[2] = static_cast<int>(dvals[2]);
            values[3] = static_cast<int>(dvals[3]);
            values[4] = static_cast<int>(dvals[4]);
            values[5] = static_cast<int>(dvals[5]);
        }
        return err;

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break; /* i64 only */
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
        break; /* Double only */
    case AL_STEREO_ANGLES:
        break; /* Float/double only */

    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
        break; /* ??? */
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}